

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.h
# Opt level: O1

void __thiscall HttpResponse::HttpResponse(HttpResponse *this)

{
  void *pvVar1;
  long lVar2;
  undefined1 local_c9b;
  undefined1 local_c9a;
  undefined1 local_c99;
  pair<const_CharContent,_CharContent> local_c98;
  pair<const_CharContent,_CharContent> local_c48;
  pair<const_CharContent,_CharContent> local_bf8;
  pair<const_CharContent,_CharContent> local_ba8;
  pair<const_CharContent,_CharContent> local_b58;
  pair<const_CharContent,_CharContent> local_b08;
  pair<const_CharContent,_CharContent> local_ab8;
  pair<const_CharContent,_CharContent> local_a68;
  pair<const_CharContent,_CharContent> local_a18;
  pair<const_CharContent,_CharContent> local_9c8;
  pair<const_CharContent,_CharContent> local_978;
  pair<const_CharContent,_CharContent> local_928;
  pair<const_CharContent,_CharContent> local_8d8;
  pair<const_CharContent,_CharContent> local_888;
  pair<const_CharContent,_CharContent> local_838;
  pair<const_CharContent,_CharContent> local_7e8;
  pair<const_CharContent,_CharContent> local_798;
  pair<const_CharContent,_CharContent> local_748;
  pair<const_CharContent,_CharContent> local_6f8;
  pair<const_CharContent,_CharContent> local_6a8;
  pair<const_CharContent,_CharContent> local_658;
  pair<const_CharContent,_CharContent> local_608;
  pair<const_CharContent,_CharContent> local_5b8;
  pair<const_CharContent,_CharContent> local_568;
  pair<const_CharContent,_CharContent> local_518;
  pair<const_CharContent,_CharContent> local_4c8;
  pair<const_CharContent,_CharContent> local_478;
  pair<const_CharContent,_CharContent> local_428;
  pair<const_CharContent,_CharContent> local_3d8;
  pair<const_CharContent,_CharContent> local_388;
  pair<const_CharContent,_CharContent> local_338;
  pair<const_CharContent,_CharContent> local_2e8;
  pair<const_CharContent,_CharContent> local_298;
  pair<const_CharContent,_CharContent> local_248;
  pair<const_CharContent,_CharContent> local_1f8;
  pair<const_CharContent,_CharContent> local_1a8;
  pair<const_CharContent,_CharContent> local_158;
  pair<const_CharContent,_CharContent> local_108;
  pair<const_CharContent,_CharContent> local_b8;
  pair<const_CharContent,_CharContent> local_68;
  
  this->_vptr_HttpResponse = (_func_int **)&PTR__HttpResponse_00117c78;
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[9],_true>
            (&local_c98,(char (*) [4])"100",(char (*) [9])"Continue");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[20],_true>
            (&local_c48,(char (*) [4])"101",(char (*) [20])"Switching Protocols");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[3],_true>
            (&local_bf8,(char (*) [4])"200",(char (*) [3])"OK");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[8],_true>
            (&local_ba8,(char (*) [4])"201",(char (*) [8])"Created");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[9],_true>
            (&local_b58,(char (*) [4])"202",(char (*) [9])"Accepted");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[30],_true>
            (&local_b08,(char (*) [4])"203",(char (*) [30])"Non-Authoritative Information");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[11],_true>
            (&local_ab8,(char (*) [4])"204",(char (*) [11])"No Content");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[14],_true>
            (&local_a68,(char (*) [4])"205",(char (*) [14])"Reset Content");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[16],_true>
            (&local_a18,(char (*) [4])"206",(char (*) [16])"Partial Content");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[17],_true>
            (&local_9c8,(char (*) [4])"300",(char (*) [17])"Multiple Choices");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[18],_true>
            (&local_978,(char (*) [4])"301",(char (*) [18])"Moved Permanently");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[6],_true>
            (&local_928,(char (*) [4])"302",(char (*) [6])0x1123e5);
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[10],_true>
            (&local_8d8,(char (*) [4])"303",(char (*) [10])"See Other");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[13],_true>
            (&local_888,(char (*) [4])"304",(char (*) [13])"Not Modified");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[10],_true>
            (&local_838,(char (*) [4])"305",(char (*) [10])"Use Proxy");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[19],_true>
            (&local_7e8,(char (*) [4])"307",(char (*) [19])"Temporary Redirect");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[12],_true>
            (&local_798,(char (*) [4])"400",(char (*) [12])"Bad Request");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[13],_true>
            (&local_748,(char (*) [4])"401",(char (*) [13])"Unauthorized");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[17],_true>
            (&local_6f8,(char (*) [4])"402",(char (*) [17])"Payment Required");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[10],_true>
            (&local_6a8,(char (*) [4])"403",(char (*) [10])"Forbidden");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[10],_true>
            (&local_658,(char (*) [4])"404",(char (*) [10])"Not Found");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[19],_true>
            (&local_608,(char (*) [4])"405",(char (*) [19])"Method Not Allowed");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[15],_true>
            (&local_5b8,(char (*) [4])"406",(char (*) [15])"Not Acceptable");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[30],_true>
            (&local_568,(char (*) [4])"407",(char (*) [30])"Proxy Authentication Required");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[16],_true>
            (&local_518,(char (*) [4])"408",(char (*) [16])"Request Timeout");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[9],_true>
            (&local_4c8,(char (*) [4])"409",(char (*) [9])"Conflict");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[5],_true>
            (&local_478,(char (*) [4])"410",(char (*) [5])"Gone");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[16],_true>
            (&local_428,(char (*) [4])"411",(char (*) [16])"Length Required");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[20],_true>
            (&local_3d8,(char (*) [4])"412",(char (*) [20])"Precondition Failed");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[25],_true>
            (&local_388,(char (*) [4])"413",(char (*) [25])"Request Entity Too Large");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[21],_true>
            (&local_338,(char (*) [4])"414",(char (*) [21])"Request-URI Too Long");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[23],_true>
            (&local_2e8,(char (*) [4])"415",(char (*) [23])"Unsupported Media Type");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[32],_true>
            (&local_298,(char (*) [4])"416",(char (*) [32])"Requested Range Not Satisfiable");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[19],_true>
            (&local_248,(char (*) [4])"417",(char (*) [19])"Expectation Failed");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[22],_true>
            (&local_1f8,(char (*) [4])"500",(char (*) [22])"Internal Server Error");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[16],_true>
            (&local_1a8,(char (*) [4])"501",(char (*) [16])"Not Implemented");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[12],_true>
            (&local_158,(char (*) [4])"502",(char (*) [12])"Bad Gateway");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[20],_true>
            (&local_108,(char (*) [4])"503",(char (*) [20])"Service Unavailable");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[16],_true>
            (&local_b8,(char (*) [4])"504",(char (*) [16])"Gateway Timeout");
  std::pair<const_CharContent,_CharContent>::pair<const_char_(&)[4],_const_char_(&)[27],_true>
            (&local_68,(char (*) [4])"505",(char (*) [27])"HTTP Version Not Supported");
  std::
  _Hashtable<CharContent,std::pair<CharContent_const,CharContent>,std::allocator<std::pair<CharContent_const,CharContent>>,std::__detail::_Select1st,EqualFunc,hashFunc,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<CharContent_const,CharContent>const*>
            ((_Hashtable<CharContent,std::pair<CharContent_const,CharContent>,std::allocator<std::pair<CharContent_const,CharContent>>,std::__detail::_Select1st,EqualFunc,hashFunc,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&this->response_code_map,&local_c98,&stack0xffffffffffffffe8,0,&local_c99,&local_c9a
             ,&local_c9b);
  lVar2 = 0xc30;
  do {
    *(undefined ***)((long)&local_c98.second._vptr_CharContent + lVar2) = &PTR__CharContent_00117c48
    ;
    pvVar1 = *(void **)((long)&local_c98.second.m + lVar2);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
    *(undefined ***)((long)&local_c98.first._vptr_CharContent + lVar2) = &PTR__CharContent_00117c48;
    pvVar1 = *(void **)((long)&local_c98.first.m + lVar2);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
    lVar2 = lVar2 + -0x50;
  } while (lVar2 != -0x50);
  return;
}

Assistant:

HttpResponse():response_code_map({//come from RFC2616
                                             //1xx
                                             {"100","Continue"},
                                             {"101","Switching Protocols"},
                                             //2xx
                                             {"200","OK"},
                                             {"201","Created"},
                                             {"202","Accepted"},
                                             {"203","Non-Authoritative Information"},
                                             {"204","No Content"},
                                             {"205","Reset Content"},
                                             {"206","Partial Content"},
                                             //3xx
                                             {"300","Multiple Choices"},
                                             {"301","Moved Permanently"},
                                             {"302","Found"},
                                             {"303","See Other"},
                                             {"304","Not Modified"},
                                             {"305","Use Proxy"},
                                             {"307","Temporary Redirect"},
                                             //4xx
                                             {"400","Bad Request"},
                                             {"401","Unauthorized"},
                                             {"402","Payment Required"},
                                             {"403","Forbidden"},
                                             {"404","Not Found"},
                                             {"405","Method Not Allowed"},
                                             {"406","Not Acceptable"},
                                             {"407","Proxy Authentication Required"},
                                             {"408","Request Timeout"},
                                             {"409","Conflict"},
                                             {"410","Gone"},
                                             {"411","Length Required"},
                                             {"412","Precondition Failed"},
                                             {"413","Request Entity Too Large"},
                                             {"414","Request-URI Too Long"},
                                             {"415","Unsupported Media Type"},
                                             {"416","Requested Range Not Satisfiable"},
                                             {"417","Expectation Failed"},
                                             //5xx
                                             {"500","Internal Server Error"},
                                             {"501","Not Implemented"},
                                             {"502","Bad Gateway"},
                                             {"503","Service Unavailable"},
                                             {"504","Gateway Timeout"},
                                             {"505","HTTP Version Not Supported"}
                                     }){}